

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

message_order * __thiscall
FIX::DataDictionary::MessageFieldsOrderHolder::getMessageOrder(MessageFieldsOrderHolder *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  int *order;
  reference piVar5;
  message_order local_60;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  const_iterator iter;
  int *i;
  int *tmp;
  MessageFieldsOrderHolder *this_local;
  
  bVar2 = message_order::operator_cast_to_bool(&this->m_msgOrder);
  if (!bVar2) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->m_orderedFlds);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar3 + 1;
    uVar4 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    order = (int *)operator_new__(uVar4);
    iter._M_current = order;
    local_30._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->m_orderedFlds)
    ;
    while( true ) {
      local_38._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(&this->m_orderedFlds)
      ;
      bVar2 = __gnu_cxx::operator!=(&local_30,&local_38);
      if (!bVar2) break;
      local_40 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator++(&local_30,0);
      piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_40);
      *iter._M_current = *piVar5;
      iter._M_current = iter._M_current + 1;
    }
    *iter._M_current = 0;
    message_order::message_order(&local_60,order);
    message_order::operator=(&this->m_msgOrder,&local_60);
    message_order::~message_order(&local_60);
    if (order != (int *)0x0) {
      operator_delete__(order);
    }
  }
  return &this->m_msgOrder;
}

Assistant:

const message_order &getMessageOrder() const {
      if (m_msgOrder) {
        return m_msgOrder;
      }

      int *tmp = new int[m_orderedFlds.size() + 1];
      int *i = tmp;

      for (OrderedFields::const_iterator iter = m_orderedFlds.begin(); iter != m_orderedFlds.end();
           *(i++) = *(iter++)) {}
      *i = 0;

      m_msgOrder = message_order(tmp);
      delete[] tmp;

      return m_msgOrder;
    }